

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_at_line_end(Parser *this)

{
  long in_RDI;
  csubstr r;
  bool local_31;
  basic_substring<const_char> local_20;
  basic_substring<const_char> *local_8;
  
  local_20.str = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
  local_20.len = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
  local_8 = &local_20;
  local_31 = true;
  if (local_20.len != 0 && local_20.str != (char *)0x0) {
    local_31 = basic_substring<const_char>::begins_with(&local_20,' ',local_20.len);
  }
  return local_31;
}

Assistant:

inline bool _at_line_end() const
    {
        csubstr r = m_state->line_contents.rem;
        return r.empty() || r.begins_with(' ', r.len);
    }